

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::draw_particles(Fluid *this,mat4 *projection,mat4 *view,vec4 *viewport)

{
  PFNGLUNIFORM3FVPROC p_Var1;
  PFNGLUNIFORM4FVPROC p_Var2;
  PFNGLUNIFORMMATRIX4FVPROC p_Var3;
  GLint GVar4;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  allocator<char> local_b9;
  vec4 *local_b8;
  GLchar *local_b0 [4];
  GLchar *local_90 [4];
  GLchar *local_70 [4];
  GLchar *local_50 [4];
  
  local_b8 = viewport;
  gfx::Program::use(&this->program);
  p_Var3 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"projection",&local_b9);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_50[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)projection);
  std::__cxx11::string::~string((string *)local_50);
  p_Var3 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"view",&local_b9);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_70[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  std::__cxx11::string::~string((string *)local_70);
  p_Var2 = glad_glUniform4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"viewport",&local_b9);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_90[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)local_b8);
  std::__cxx11::string::~string((string *)local_90);
  p_Var1 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"look",&local_b9);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_b0[0]);
  __fd = 1;
  (*p_Var1)(GVar4,1,(GLfloat *)&this->look);
  std::__cxx11::string::~string((string *)local_b0);
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,(this->particle_ssbo)._length);
  gfx::VAO::unbind(&this->vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_particles(const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        program.use();
        glUniformMatrix4fv(program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform4fv(program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
        glUniform3fv(program.uniform_loc("look"), 1, glm::value_ptr(look));
        vao.bind();
        glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
        vao.unbind();
        program.disuse();
    }